

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

ParseNodePtr __thiscall Parser::ParseImport<false>(Parser *this)

{
  Scanner_t *this_00;
  tokens tVar1;
  SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  code *pcVar3;
  SListNodeBase<Memory::ArenaAllocator> buffer;
  IdentPtr this_01;
  bool bVar4;
  charcount_t ichMin;
  undefined4 *puVar5;
  ParseNodePtr pPVar6;
  Parser *this_02;
  undefined1 auStack_78 [8];
  RestorePoint parsedImport;
  SListNodeBase<Memory::ArenaAllocator> SStack_38;
  BOOL fCanAssign;
  IdentToken token;
  
  if (((this->m_scriptContext->config).threadConfig)->m_ES6Module == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0xac7,"(m_scriptContext->GetConfig()->IsES6ModuleEnabled())",
                       "m_scriptContext->GetConfig()->IsES6ModuleEnabled()");
    if (!bVar4) goto LAB_00e7c93e;
    *puVar5 = 0;
  }
  if ((this->m_token).tk != tkIMPORT) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0xac8,"(m_token.tk == tkIMPORT)","m_token.tk == tkIMPORT");
    if (!bVar4) {
LAB_00e7c93e:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  this_00 = &this->m_scan;
  ichMin = Scanner<UTF8EncodingPolicyBase<false>_>::IchMinTok(this_00);
  parsedImport.m_cMinTokMultiUnits._0_4_ = 0xffffffff;
  parsedImport.m_cMinTokMultiUnits._4_4_ = 0xffffffff;
  parsedImport.m_cMinLineMultiUnits._0_4_ = 0xffffffff;
  auStack_78._0_4_ = 0xffffffff;
  auStack_78._4_4_ = 0xffffffff;
  parsedImport.m_ichMinTok = 0xffffffff;
  parsedImport.m_ichMinLine = 0xffffffff;
  parsedImport._20_16_ = (undefined1  [16])0x0;
  parsedImport.m_fHadEol = -1;
  parsedImport._44_4_ = 0xffffffff;
  Scanner<UTF8EncodingPolicyBase<false>_>::Capture(this_00,(RestorePoint *)auStack_78);
  this_02 = (Parser *)this_00;
  Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
  tVar1 = (this->m_token).tk;
  if (tVar1 == tkDot) {
    if (((this->m_scriptContext->config).threadConfig)->m_ESImportMeta == true) {
      ParseMetaProperty<false>(this,tkIMPORT,ichMin,(BOOL *)&stack0xffffffffffffffc8);
      Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo(this_00,(RestorePoint *)auStack_78);
      pPVar6 = ParseExpr<false>(this,0,(BOOL *)0x0,1,0,(LPCOLESTR)0x0,(uint32 *)0x0,(uint32 *)0x0,
                                (IdentToken *)0x0,false,(bool *)0x0,(charcount_t *)0x0,(bool *)0x0);
      return pPVar6;
    }
  }
  else if (tVar1 == tkLParen) {
    if (((this->m_scriptContext->config).threadConfig)->m_ESDynamicImport != false) {
      pPVar6 = ParseImportCall<false>(this);
      SStack_38.next = (Type)((ulong)(uint)fCanAssign << 0x20);
      token.tk = tkNone;
      token._4_4_ = 0;
      pPVar6 = ParsePostfixOperators<false>
                         (this,pPVar6,1,0,0,1,(BOOL *)((long)&parsedImport.m_cMultiUnits + 4),
                          (IdentToken *)&stack0xffffffffffffffc8,(bool *)0x0);
      return pPVar6;
    }
    Error(this_02,-0x7ff5fbb7,L"",L"");
  }
  Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo(this_00,(RestorePoint *)auStack_78);
  CheckIfImportOrExportStatementValidHere(this);
  Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
  if ((this->m_token).tk == tkStrCon) {
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
  }
  else {
    token._0_8_ = (ulong)(uint)token._4_4_ << 0x20;
    SStack_38.next = (Type)&stack0xffffffffffffffc8;
    token.pid = (IdentPtr)this;
    ParseImportClause<false>
              (this,(SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                    &stack0xffffffffffffffc8,false);
    ParseImportOrExportFromClause<false>(this,true);
    this_01 = token.pid;
    buffer.next = SStack_38.next;
    while ((SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)buffer.next !=
           (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
           &stack0xffffffffffffffc8) {
      pSVar2 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
               (((SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)buffer.next)
               ->super_SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>).
               super_SListNodeBase<Memory::ArenaAllocator>.next;
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_01,
                 buffer.next,0x38);
      buffer.next = (Type)pSVar2;
    }
    token._0_8_ = token._0_8_ & 0xffffffff00000000;
    SStack_38.next = (Type)&stack0xffffffffffffffc8;
    SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::~SList
              ((SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
               &stack0xffffffffffffffc8);
  }
  return (ParseNodePtr)0x0;
}

Assistant:

ParseNodePtr Parser::ParseImport()
{
    Assert(m_scriptContext->GetConfig()->IsES6ModuleEnabled());
    Assert(m_token.tk == tkIMPORT);

    charcount_t ichMin = this->GetScanner()->IchMinTok();
    RestorePoint parsedImport;
    this->GetScanner()->Capture(&parsedImport);
    this->GetScanner()->Scan();

    // import()
    if (m_token.tk == tkLParen)
    {
        if (!m_scriptContext->GetConfig()->IsESDynamicImportEnabled())
        {
            Error(ERRExperimental);
        }

        ParseNodePtr pnode = ParseImportCall<buildAST>();
        BOOL fCanAssign;
        IdentToken token;
        return ParsePostfixOperators<buildAST>(pnode, TRUE, FALSE, FALSE, TRUE, &fCanAssign, &token);
    }
    else if (m_token.tk == tkDot && m_scriptContext->GetConfig()->IsESImportMetaEnabled())
    {
        BOOL fCanAssign;
        ParseMetaProperty<buildAST>(tkIMPORT, ichMin, &fCanAssign);
        this->GetScanner()->SeekTo(parsedImport);
        return ParseExpr<buildAST>();
    }

    this->GetScanner()->SeekTo(parsedImport);

    CheckIfImportOrExportStatementValidHere();

    // We just parsed an import token. Next valid token is *, {, string constant, or binding identifier.
    this->GetScanner()->Scan();

    if (m_token.tk == tkStrCon)
    {
        // This import declaration has no import clause.
        // "import ModuleSpecifier;"
        if (buildAST)
        {
            AddModuleSpecifier(m_token.GetStr());
        }

        // Scan past the module identifier.
        this->GetScanner()->Scan();
    }
    else
    {
        ModuleImportOrExportEntryList importEntryList(&m_nodeAllocator);

        // Parse the import clause (default binding can only exist before the comma).
        ParseImportClause<buildAST>(&importEntryList);

        // Token following import clause must be the identifier 'from'
        IdentPtr moduleSpecifier = ParseImportOrExportFromClause<buildAST>(true);

        if (buildAST)
        {
            Assert(moduleSpecifier != nullptr);

            AddModuleSpecifier(moduleSpecifier);

            importEntryList.Map([this, moduleSpecifier](ModuleImportOrExportEntry& importEntry) {
                importEntry.moduleRequest = moduleSpecifier;
                AddModuleImportOrExportEntry(EnsureModuleImportEntryList(), &importEntry);
            });
        }

        importEntryList.Clear();
    }

    // Import statement is actually a nop, we hoist all the imported bindings to the top of the module.
    return nullptr;
}